

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O2

void * Husky::ServerFrame::ServerThread(void *lpParameter)

{
  long *plVar1;
  char *pcVar2;
  pthread_mutex_t *__mutex;
  int __fd;
  int iVar3;
  mapped_type *pmVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  key_type *this;
  allocator local_3191;
  int local_3190;
  socklen_t nSize;
  string strRec;
  string strSnd;
  linger lng;
  string strHttpResp;
  sockaddr_in clientaddr;
  HttpReqInfo httpReq;
  string local_3058;
  char chHttpHeader [2048];
  char chRecvBuf [10240];
  
  local_3190 = *lpParameter;
  plVar1 = *(long **)((long)lpParameter + 8);
  pcVar2 = *(char **)((long)lpParameter + 0x18);
  __mutex = *(pthread_mutex_t **)((long)lpParameter + 0x10);
  strHttpResp._M_dataplus._M_p = (pointer)&strHttpResp.field_2;
  strHttpResp._M_string_length = 0;
  strHttpResp.field_2._M_local_buf[0] = '\0';
  nSize = 0x10;
  do {
    if (*pcVar2 != '\0') {
      std::__cxx11::string::~string((string *)&strHttpResp);
      return (void *)0x0;
    }
    httpReq._headerMap._M_h._M_buckets = &httpReq._headerMap._M_h._M_single_bucket;
    httpReq._headerMap._M_h._M_bucket_count = 1;
    httpReq._headerMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    httpReq._headerMap._M_h._M_element_count = 0;
    httpReq._headerMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    httpReq._headerMap._M_h._M_rehash_policy._M_next_resize = 0;
    httpReq._headerMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
    httpReq._methodGetMap._M_h._M_buckets = &httpReq._methodGetMap._M_h._M_single_bucket;
    httpReq._methodGetMap._M_h._M_bucket_count = 1;
    httpReq._methodGetMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    httpReq._methodGetMap._M_h._M_element_count = 0;
    httpReq._methodGetMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    httpReq._methodGetMap._M_h._M_rehash_policy._M_next_resize = 0;
    httpReq._methodGetMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
    httpReq._methodPostMap._M_h._M_buckets = &httpReq._methodPostMap._M_h._M_single_bucket;
    httpReq._methodPostMap._M_h._M_bucket_count = 1;
    httpReq._methodPostMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    httpReq._methodPostMap._M_h._M_element_count = 0;
    httpReq._methodPostMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    httpReq._methodPostMap._M_h._M_rehash_policy._M_next_resize = 0;
    httpReq._methodPostMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pthread_mutex_lock(__mutex);
    __fd = accept(local_3190,(sockaddr *)&clientaddr,&nSize);
    pthread_mutex_unlock(__mutex);
    if (__fd == -1) {
      if (*pcVar2 == '\0') {
        std::__cxx11::string::string((string *)chHttpHeader,"error [%s]",(allocator *)&strRec);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xe4,(key_type *)chHttpHeader,pcVar6);
        this = (key_type *)chHttpHeader;
        goto LAB_00116f05;
      }
    }
    else {
      inet_ntoa((in_addr)clientaddr.sin_addr.s_addr);
      std::__cxx11::string::string((string *)chHttpHeader,"CLIENT_IP",(allocator *)&strRec);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&httpReq,(key_type *)chHttpHeader);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)chHttpHeader);
      lng.l_onoff = 1;
      lng.l_linger = 1;
      iVar3 = setsockopt(__fd,1,0xd,&lng,8);
      if (iVar3 == -1) {
        std::__cxx11::string::string((string *)chHttpHeader,"error [%s]",(allocator *)&strRec);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xee,(key_type *)chHttpHeader,pcVar6);
        std::__cxx11::string::~string((string *)chHttpHeader);
      }
      iVar3 = setsockopt(__fd,1,0x14,SOCKET_TIMEOUT,0x10);
      if (iVar3 == -1) {
        std::__cxx11::string::string((string *)chHttpHeader,"error [%s]",(allocator *)&strRec);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xf3,(key_type *)chHttpHeader,pcVar6);
        std::__cxx11::string::~string((string *)chHttpHeader);
      }
      iVar3 = setsockopt(__fd,1,0x15,SOCKET_TIMEOUT,0x10);
      if (iVar3 == -1) {
        std::__cxx11::string::string((string *)chHttpHeader,"error [%s]",(allocator *)&strRec);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xf8,(key_type *)chHttpHeader,pcVar6);
        std::__cxx11::string::~string((string *)chHttpHeader);
      }
      strRec._M_dataplus._M_p = (pointer)&strRec.field_2;
      strRec._M_string_length = 0;
      strRec.field_2._M_local_buf[0] = '\0';
      strSnd._M_dataplus._M_p = (pointer)&strSnd.field_2;
      strSnd._M_string_length = 0;
      strSnd.field_2._M_local_buf[0] = '\0';
      memset(chRecvBuf,0,0x2800);
      sVar7 = recv(__fd,chRecvBuf,0x2800,0);
      std::__cxx11::string::assign((char *)&strRec);
      if ((int)sVar7 == 0) {
        std::__cxx11::string::string
                  ((string *)chHttpHeader,"connection has been gracefully closed",
                   (allocator *)&local_3058);
        Limonp::Logger::LoggingF(0,"ServerFrame.hpp",0x10e,(key_type *)chHttpHeader);
LAB_00116e19:
        std::__cxx11::string::~string((string *)chHttpHeader);
        close(__fd);
      }
      else {
        if ((int)sVar7 == -1) {
          std::__cxx11::string::string((string *)chHttpHeader,"error [%s]",(allocator *)&local_3058)
          ;
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          Limonp::Logger::LoggingF(0,"ServerFrame.hpp",0x108,(key_type *)chHttpHeader,pcVar6);
          goto LAB_00116e19;
        }
        HttpReqInfo::load(&httpReq,&strRec);
        (**(code **)(*plVar1 + 0x20))(plVar1,&httpReq,&strSnd);
        sprintf(chHttpHeader,
                "HTTP/1.1 200 OK\r\nConnection: close\r\nServer: FrameServer/1.0.0\r\nContent-Type: text/json; charset=%s\r\nContent-Length: %d\r\n\r\n"
                ,"UTF-8");
        std::__cxx11::string::assign((char *)&strHttpResp);
        std::__cxx11::string::append((string *)&strHttpResp);
        sVar7 = send(__fd,strHttpResp._M_dataplus._M_p,strHttpResp._M_string_length,0);
        if (sVar7 == -1) {
          std::__cxx11::string::string((string *)&local_3058,"error [%s]",&local_3191);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x122,&local_3058,pcVar6);
          std::__cxx11::string::~string((string *)&local_3058);
        }
        close(__fd);
      }
      std::__cxx11::string::~string((string *)&strSnd);
      this = &strRec;
LAB_00116f05:
      std::__cxx11::string::~string((string *)this);
    }
    HttpReqInfo::~HttpReqInfo(&httpReq);
  } while( true );
}

Assistant:

static void * ServerThread(void * lpParameter )
            {
                SPara *pPara=(SPara*)lpParameter;
                SOCKET hSockLsn=pPara->hSock;
                IRequestHandler *pHandler=pPara->pHandler;
                bool* pShutdown = pPara->pShutdown;
                pthread_mutex_t* ppmAccept = pPara->ppmAccept;

                int nRetCode;
                linger lng;
                char chRecvBuf[RECV_BUFFER];

                SOCKET hClientSock;
                string strHttpResp;

                sockaddr_in clientaddr;
                socklen_t nSize = sizeof(clientaddr);
                while(!(*pShutdown))
                {		
                    HttpReqInfo httpReq;
                    pthread_mutex_lock(ppmAccept);
                    hClientSock=accept(hSockLsn,(sockaddr *)&clientaddr, &nSize);
                    pthread_mutex_unlock(ppmAccept);

                    if(hClientSock==SOCKET_ERROR)
                    {
                        if(!(*pShutdown))
                          LogError("error [%s]", strerror(errno));
                        continue;
                    }

                    httpReq[CLIENT_IP_K] = inet_ntoa(clientaddr.sin_addr);// inet_ntoa is not thread safety at some version 

                    lng.l_linger=1;
                    lng.l_onoff=1;				
                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_LINGER,(char*)&lng,sizeof(lng)))			
                    {
                        LogError("error [%s]", strerror(errno));
                    }

                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_RCVTIMEO,(char*)&SOCKET_TIMEOUT,sizeof(SOCKET_TIMEOUT)))
                    {
                        LogError("error [%s]", strerror(errno));
                    }

                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_SNDTIMEO,(char*)&SOCKET_TIMEOUT,sizeof(SOCKET_TIMEOUT)))
                    {
                        LogError("error [%s]", strerror(errno));
                    }


                    string strRec;
                    string strSnd;
                    memset(chRecvBuf,0,sizeof(chRecvBuf));
                    nRetCode = recv(hClientSock, chRecvBuf, RECV_BUFFER, 0);	
                    strRec = chRecvBuf;

#ifdef HUKSY_DEBUG
                    LogDebug("request[%s]", strRec.c_str());
#endif

                    if(SOCKET_ERROR==nRetCode)
                    {
                        LogDebug("error [%s]", strerror(errno));
                        closesocket(hClientSock);
                        continue;
                    }
                    if(0==nRetCode)
                    {
                        LogDebug("connection has been gracefully closed");
                        closesocket(hClientSock);
                        continue;
                    }
                    httpReq.load(strRec);

                    pHandler->do_GET(httpReq, strSnd);

                    char chHttpHeader[2048];

                    sprintf(chHttpHeader, RESPONSE_FORMAT, RESPONSE_CHARSET_UTF8, int(strSnd.length()));

                    strHttpResp=chHttpHeader;
                    strHttpResp+=strSnd;
#ifdef HUKSY_DEBUG
                    LogDebug("response'body [%s]", strSnd.c_str());
#endif

                    if (SOCKET_ERROR==send(hClientSock,strHttpResp.c_str(),strHttpResp.length(),0))
                    {
                        LogError("error [%s]", strerror(errno));
                    }


                    closesocket(hClientSock);
                }

                return 0;

            }